

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  ~cmNinjaNormalTargetGenerator(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator()
{
  delete this->OSXBundleGenerator;
}